

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_camera.c
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long in_RSI;
  int in_EDI;
  int i;
  ALLEGRO_EVENT event;
  char *skybox_name;
  int redraw;
  ALLEGRO_EVENT_QUEUE *queue;
  ALLEGRO_TIMER *timer;
  ALLEGRO_DISPLAY *display;
  int local_84;
  int local_80 [8];
  int local_60;
  int local_50;
  int local_4c;
  uint local_40;
  long local_38;
  int local_2c;
  undefined8 local_28;
  undefined8 local_20;
  long local_18;
  undefined4 local_4;
  
  local_4 = 0;
  local_2c = 0;
  local_38 = 0;
  if (1 < in_EDI) {
    local_38 = *(long *)(in_RSI + 8);
  }
  uVar4 = al_install_system(0x5020700,atexit);
  if ((uVar4 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  al_init_font_addon();
  al_init_primitives_addon();
  init_platform_specific();
  al_install_keyboard();
  al_install_mouse();
  al_set_new_display_option(0x11,1,2);
  al_set_new_display_option(0x12,8,2);
  al_set_new_display_option(0xf,0x10,2);
  al_set_new_display_flags(0x10);
  local_18 = al_create_display(0x280,0x168);
  if (local_18 == 0) {
    abort_example("Error creating display\n");
  }
  if (local_38 != 0) {
    al_init_image_addon();
    ex.skybox = (ALLEGRO_BITMAP *)al_load_bitmap(local_38);
    lVar1 = local_38;
    if (ex.skybox == (ALLEGRO_BITMAP *)0x0) {
      printf("Failed loading skybox %s\n",local_38);
    }
    else {
      uVar2 = al_get_bitmap_width(ex.skybox);
      uVar3 = al_get_bitmap_height(ex.skybox);
      printf("Loaded skybox %s: %d x %d\n",lVar1,(ulong)uVar2,(ulong)uVar3);
    }
  }
  local_20 = al_create_timer(0x3f91111111111111);
  uVar5 = al_create_event_queue();
  local_28 = uVar5;
  uVar6 = al_get_keyboard_event_source();
  al_register_event_source(uVar5,uVar6);
  uVar5 = local_28;
  uVar6 = al_get_mouse_event_source();
  al_register_event_source(uVar5,uVar6);
  uVar5 = local_28;
  uVar6 = al_get_display_event_source(local_18);
  al_register_event_source(uVar5,uVar6);
  uVar5 = local_28;
  uVar6 = al_get_timer_event_source(local_20);
  al_register_event_source(uVar5,uVar6);
  setup_scene();
  al_start_timer(local_20);
  do {
    al_wait_for_event(local_28,local_80);
    if (local_80[0] == 0x2a) {
      return 0;
    }
    if (local_80[0] == 0x29) {
      al_acknowledge_resize(local_18);
    }
    else if (local_80[0] == 10) {
      if (local_60 == 0x3b) {
        return 0;
      }
      if (local_60 == 0x4b) {
        ex.controls = (ex.controls + 1) % 3;
      }
      ex.key[local_60] = 1;
      ex.keystate[local_60] = 1;
    }
    else if (local_80[0] == 0xc) {
      ex.keystate[local_60] = 0;
    }
    else if (local_80[0] == 0x1e) {
      handle_input();
      local_2c = 1;
      for (local_84 = 0; local_84 < 0xe3; local_84 = local_84 + 1) {
        if (ex.keystate[local_84] == 0) {
          ex.key[local_84] = 0;
        }
      }
      ex.mouse_dx = 0;
      ex.mouse_dy = 0;
    }
    else if (local_80[0] == 0x15) {
      ex.button[local_40] = 1;
    }
    else if (local_80[0] == 0x16) {
      ex.button[local_40] = 0;
    }
    else if (local_80[0] == 0x14) {
      ex.mouse_dx = local_50 + ex.mouse_dx;
      ex.mouse_dy = local_4c + ex.mouse_dy;
    }
    if ((local_2c != 0) && (uVar4 = al_is_event_queue_empty(local_28), (uVar4 & 1) != 0)) {
      draw_scene();
      al_flip_display();
      local_2c = 0;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   int redraw = 0;
   char const *skybox_name = NULL;

   if (argc > 1) {
      skybox_name = argv[1];
   }

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   al_init_font_addon();
   al_init_primitives_addon();
   init_platform_specific();
   al_install_keyboard();
   al_install_mouse();

   al_set_new_display_option(ALLEGRO_SAMPLE_BUFFERS, 1, ALLEGRO_SUGGEST);
   al_set_new_display_option(ALLEGRO_SAMPLES, 8, ALLEGRO_SUGGEST);
   al_set_new_display_option(ALLEGRO_DEPTH_SIZE, 16, ALLEGRO_SUGGEST);
   al_set_new_display_flags(ALLEGRO_RESIZABLE);
   display = al_create_display(640, 360);
   if (!display) {
      abort_example("Error creating display\n");
   }

   if (skybox_name) {
      al_init_image_addon();
      ex.skybox = al_load_bitmap(skybox_name);
      if (ex.skybox) {
         printf("Loaded skybox %s: %d x %d\n", skybox_name,
            al_get_bitmap_width(ex.skybox),
            al_get_bitmap_height(ex.skybox));
      }
      else {
         printf("Failed loading skybox %s\n", skybox_name);
      }
   }

   timer = al_create_timer(1.0 / 60);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_mouse_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_timer_event_source(timer));

   setup_scene();

   al_start_timer(timer);
   while (true) {
      ALLEGRO_EVENT event;

      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE)
         break;
      else if (event.type == ALLEGRO_EVENT_DISPLAY_RESIZE) {
         al_acknowledge_resize(display);
      }
      else if (event.type == ALLEGRO_EVENT_KEY_DOWN) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
            break;
         if (event.keyboard.keycode == ALLEGRO_KEY_SPACE) {
            ex.controls++;
            ex.controls %= 3;
         }
         ex.key[event.keyboard.keycode] = 1;
         ex.keystate[event.keyboard.keycode] = 1;
      }
      else if (event.type == ALLEGRO_EVENT_KEY_UP) {
         /* In case a key gets pressed and immediately released, we will still
          * have set ex.key so it is not lost.
          */
         ex.keystate[event.keyboard.keycode] = 0;
      }
      else if (event.type == ALLEGRO_EVENT_TIMER) {
         int i;
         handle_input();
         redraw = 1;

         /* Reset keyboard state for keys not held down anymore. */
         for (i = 0; i < ALLEGRO_KEY_MAX; i++) {
            if (ex.keystate[i] == 0)
               ex.key[i] = 0;
         }
         ex.mouse_dx = 0;
         ex.mouse_dy = 0;
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_DOWN) {
         ex.button[event.mouse.button] = 1;
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_UP) {
         ex.button[event.mouse.button] = 0;
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_AXES) {
         ex.mouse_dx += event.mouse.dx;
         ex.mouse_dy += event.mouse.dy;
      }

      if (redraw  && al_is_event_queue_empty(queue)) {
         draw_scene();

         al_flip_display();
         redraw = 0;
      }
   }

   return 0;
}